

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hpp
# Opt level: O2

void process_command_line_arguments(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  string *psVar7;
  int flags;
  int option_index;
  option long_options [15];
  
  long_options[0].name = "start";
  long_options[0].has_arg = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 0x73;
  long_options[1].name = "keymap";
  long_options[1].has_arg = 1;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0x6d;
  long_options[2].name = "output";
  long_options[2].flag = (int *)0x0;
  long_options[2].val = 0x6f;
  long_options[3].name = "us-keymap";
  long_options[3].has_arg = 0;
  long_options[3].flag = (int *)0x0;
  long_options[3].val = 0x75;
  long_options[4].name = "kill";
  long_options[4].has_arg = 0;
  long_options[4].flag = (int *)0x0;
  long_options[4].val = 0x6b;
  long_options[5].name = "device";
  long_options[5].flag = (int *)0x0;
  long_options[5].val = 100;
  long_options[6].name = "help";
  long_options[6].has_arg = 0;
  long_options[6].flag = (int *)0x0;
  long_options[6].val = 0x3f;
  long_options[7].name = "export-keymap";
  long_options[7].flag = &flags;
  long_options[8].name = "no-func-keys";
  long_options[8].has_arg = 0;
  long_options[8].val = 2;
  long_options[9].name = "no-timestamps";
  long_options[9].has_arg = 0;
  long_options[9].val = 4;
  long_options[10].name = "post-http";
  long_options[10].val = 8;
  long_options[0xb].name = "post-irc";
  long_options[0xb].val = 0x10;
  long_options[0xc].name = "post-size";
  long_options[0xc].val = 0x20;
  long_options[0xd].name = "no-daemon";
  long_options[0xd].has_arg = 0;
  long_options[0xd].val = 0x40;
  long_options[0xe].flag = (int *)0x0;
  long_options[0xe].val = 0;
  long_options[0xe]._28_4_ = 0;
  long_options[0xe].name = (char *)0x0;
  long_options[0xe].has_arg = 0;
  long_options[0xe]._12_4_ = 0;
  long_options[2].has_arg = long_options[1].has_arg;
  long_options[5].has_arg = long_options[1].has_arg;
  long_options[7].has_arg = long_options[1].has_arg;
  long_options[7].val = long_options[1].has_arg;
  long_options[8].flag = long_options[7].flag;
  long_options[9].flag = long_options[7].flag;
  long_options[10].has_arg = long_options[1].has_arg;
  long_options[10].flag = long_options[7].flag;
  long_options[0xb].has_arg = long_options[1].has_arg;
  long_options[0xb].flag = long_options[7].flag;
  long_options[0xc].has_arg = long_options[1].has_arg;
  long_options[0xc].flag = long_options[7].flag;
  long_options[0xd].flag = long_options[7].flag;
LAB_00105b3a:
  do {
    iVar2 = getopt_long(argc,argv,"sm:o:ukd:?",long_options,&option_index);
    pcVar4 = _optarg;
    switch(iVar2) {
    case 0x6b:
      args.kill = true;
      goto LAB_00105b3a;
    case 0x6c:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
switchD_00105b61_caseD_6c:
      usage();
      exit(1);
    case 0x6d:
switchD_00105b61_caseD_6d:
      std::__cxx11::string::assign((char *)&args.keymap);
      goto LAB_00105b3a;
    case 0x6f:
      std::__cxx11::string::assign((char *)&args.logfile);
      goto LAB_00105b3a;
    case 0x73:
      args.start = true;
      goto LAB_00105b3a;
    case 0x75:
      args.us_keymap = true;
      goto LAB_00105b3a;
    }
    if (iVar2 == 0) {
      args.flags = args.flags | flags;
      if (flags == 0x20) {
        iVar2 = atoi(_optarg);
        lVar6 = (long)iVar2;
        args.post_size = lVar6;
        sVar5 = strlen(pcVar4);
        cVar1 = pcVar4[sVar5 - 1];
        if (cVar1 != 'K') {
          if ((cVar1 == 'M') || (cVar1 == 'm')) {
            args.post_size = lVar6 * 1000000;
            goto LAB_00105b3a;
          }
          if (cVar1 != 'k') goto LAB_00105b3a;
        }
        args.post_size = lVar6 * 1000;
        goto LAB_00105b3a;
      }
      if (flags == 8) {
        iVar2 = strncmp(_optarg,"http://",7);
        if (iVar2 != 0) {
          error(1,0,"HTTP URL must be like \"http://domain:port/script\"");
        }
        psVar7 = &args.http_url;
      }
      else {
        if (flags != 0x10) {
          if (flags == 1) goto switchD_00105b61_caseD_6d;
          goto LAB_00105b3a;
        }
        pcVar3 = strrchr(_optarg,0x40);
        pcVar4 = strrchr(pcVar4,0x3a);
        if (pcVar3 == (char *)0x0 || pcVar4 == (char *)0x0) {
          error(1,0,"Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
        }
        *pcVar3 = '\0';
        *pcVar4 = '\0';
        std::__cxx11::string::assign((char *)&args.irc_entity);
        std::__cxx11::string::assign((char *)&args.irc_server);
        psVar7 = &args.irc_port;
      }
      std::__cxx11::string::assign((char *)psVar7);
      goto LAB_00105b3a;
    }
    if (iVar2 != 100) {
      if (iVar2 == -1) {
        while (lVar6 = (long)_optind, _optind < argc) {
          _optind = _optind + 1;
          error(0,0,"Non-option argument %s",argv[lVar6]);
        }
        return;
      }
      if (iVar2 == 0x3f) {
        usage();
        exit(0);
      }
      goto switchD_00105b61_caseD_6c;
    }
    std::__cxx11::string::assign((char *)&args.device);
  } while( true );
}

Assistant:

void process_command_line_arguments(int argc, char **argv)
{
    int flags;

    struct option long_options[] = {
        {"start",     no_argument,       0, 's'},
        {"keymap",    required_argument, 0, 'm'},
        {"output",    required_argument, 0, 'o'},
        {"us-keymap", no_argument,       0, 'u'},
        {"kill",      no_argument,       0, 'k'},
        {"device",    required_argument, 0, 'd'},
        {"help",      no_argument,       0, '?'},
        {"export-keymap", required_argument, &flags, FLAG_EXPORT_KEYMAP},
        {"no-func-keys",  no_argument,       &flags, FLAG_NO_FUNC_KEYS},
        {"no-timestamps", no_argument,       &flags, FLAG_NO_TIMESTAMPS},
        {"post-http",     required_argument, &flags, FLAG_POST_HTTP},
        {"post-irc",      required_argument, &flags, FLAG_POST_IRC},
        {"post-size",     required_argument, &flags, FLAG_POST_SIZE},
        {"no-daemon",     no_argument,       &flags, FLAG_NO_DAEMON},
        {0}
    };

    int c;
    int option_index;

    while ((c = getopt_long(argc, argv, "sm:o:ukd:?", long_options, &option_index)) != -1)
    {
        switch (c)
        {
        case 's': args.start = true;     break;
        case 'm': args.keymap = optarg;  break;
        case 'o': args.logfile = optarg; break;
        case 'u': args.us_keymap = true; break;
        case 'k': args.kill = true;      break;
        case 'd': args.device = optarg;  break;

        case  0:
            args.flags |= flags;
            switch (flags)
            {
            case FLAG_EXPORT_KEYMAP: args.keymap = optarg; break;

            case FLAG_POST_HTTP:
                if (strncmp(optarg, "http://", 7)  != 0)
                    error(EXIT_FAILURE, 0, "HTTP URL must be like \"http://domain:port/script\"");
                args.http_url = optarg;
                break;

            case FLAG_POST_IRC: {
                // optarg string should be like "entity@server:port", now dissect it
                char *main_sep = strrchr(optarg, '@');
                char *port_sep = strrchr(optarg, ':');
                if (main_sep == NULL || port_sep == NULL)
                    error(EXIT_FAILURE, 0, "Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
                *main_sep = '\0';                                                 // replace @ with \0 to have entity string that starts at optarg
                *port_sep = '\0';                                                 // replace : with \0 to have server string that starts at main_sep+1
                args.irc_entity = optarg;
                args.irc_server = main_sep + 1;
                args.irc_port = port_sep + 1;
                break;
            }

            case FLAG_POST_SIZE:
                args.post_size = atoi(optarg);
                switch (optarg[strlen(optarg) - 1])                                                 // process any trailing M(egabytes) or K(ilobytes)
                {
                case 'K': case 'k': args.post_size *= 1000;    break;
                case 'M': case 'm': args.post_size *= 1000000; break;
                }
            }
            break;

        case '?': usage(); exit(EXIT_SUCCESS);
        default: usage(); exit(EXIT_FAILURE);
        }
    }             // while

    while(optind < argc)
        error(0, 0, "Non-option argument %s", argv[optind++]);
}